

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

int ImGui::FindWindowDisplayIndex(ImGuiWindow *window)

{
  ImGuiWindow **ppIVar1;
  ImGuiWindow **ppIVar2;
  long lVar3;
  
  ppIVar1 = (GImGui->Windows).Data;
  lVar3 = (long)(GImGui->Windows).Size;
  ppIVar2 = ppIVar1;
  if (0 < lVar3) {
    do {
      if (*ppIVar2 == window) break;
      ppIVar2 = ppIVar2 + 1;
    } while (ppIVar2 < ppIVar1 + lVar3);
  }
  if ((ppIVar1 <= ppIVar2) && (ppIVar2 < ppIVar1 + lVar3)) {
    return (int)((ulong)((long)ppIVar2 - (long)ppIVar1) >> 3);
  }
  __assert_fail("it >= Data && it < Data + Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.h"
                ,0x76f,
                "int ImVector<ImGuiWindow *>::index_from_ptr(const T *) const [T = ImGuiWindow *]");
}

Assistant:

int ImGui::FindWindowDisplayIndex(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    return g.Windows.index_from_ptr(g.Windows.find(window));
}